

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

int __thiscall
httplib::Stream::write_format<char_const*,char_const*>
          (Stream *this,char *fmt,char **args,char **args_1)

{
  undefined4 uVar1;
  pointer pvVar2;
  size_type sVar3;
  reference pvVar4;
  allocator_type local_851;
  undefined1 local_850 [8];
  vector<char,_std::allocator<char>_> glowable_buf;
  undefined1 local_830 [4];
  int n;
  array<char,_2048UL> buf;
  char **args_local_1;
  char **args_local;
  char *fmt_local;
  Stream *this_local;
  
  buf._M_elems._2040_8_ = args_1;
  pvVar2 = std::array<char,_2048UL>::data((array<char,_2048UL> *)local_830);
  sVar3 = std::array<char,_2048UL>::size((array<char,_2048UL> *)local_830);
  this_local._4_4_ = snprintf(pvVar2,sVar3 - 1,fmt,*args,*(undefined8 *)buf._M_elems._2040_8_);
  if (0 < this_local._4_4_) {
    glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = this_local._4_4_;
    sVar3 = std::array<char,_2048UL>::size((array<char,_2048UL> *)local_830);
    if (this_local._4_4_ < (int)sVar3 + -1) {
      pvVar2 = std::array<char,_2048UL>::data((array<char,_2048UL> *)local_830);
      this_local._4_4_ =
           (*this->_vptr_Stream[3])
                     (this,pvVar2,
                      (long)(int)glowable_buf.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl._20_4_);
    }
    else {
      sVar3 = std::array<char,_2048UL>::size((array<char,_2048UL> *)local_830);
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_850,sVar3,&local_851);
      std::allocator<char>::~allocator(&local_851);
      while (uVar1 = glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,
            sVar3 = std::vector<char,_std::allocator<char>_>::size
                              ((vector<char,_std::allocator<char>_> *)local_850),
            (int)sVar3 + -1 <= (int)uVar1) {
        sVar3 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_850);
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)local_850,sVar3 * 2);
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_850,0);
        sVar3 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_850);
        glowable_buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
             snprintf(pvVar4,sVar3 - 1,fmt,*args,*(undefined8 *)buf._M_elems._2040_8_);
      }
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_850,0);
      this_local._4_4_ =
           (*this->_vptr_Stream[3])
                     (this,pvVar4,
                      (long)(int)glowable_buf.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl._20_4_);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_850);
    }
  }
  return this_local._4_4_;
}

Assistant:

inline int Stream::write_format(const char *fmt, const Args &... args) {
  std::array<char, 2048> buf;

#if defined(_MSC_VER) && _MSC_VER < 1900
  auto n = _snprintf_s(buf, bufsiz, buf.size() - 1, fmt, args...);
#else
  auto n = snprintf(buf.data(), buf.size() - 1, fmt, args...);
#endif
  if (n <= 0) { return n; }

  if (n >= static_cast<int>(buf.size()) - 1) {
    std::vector<char> glowable_buf(buf.size());

    while (n >= static_cast<int>(glowable_buf.size() - 1)) {
      glowable_buf.resize(glowable_buf.size() * 2);
#if defined(_MSC_VER) && _MSC_VER < 1900
      n = _snprintf_s(&glowable_buf[0], glowable_buf.size(),
                      glowable_buf.size() - 1, fmt, args...);
#else
      n = snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...);
#endif
    }
    return write(&glowable_buf[0], n);
  } else {
    return write(buf.data(), n);
  }
}